

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

void __thiscall CppGenerator::genMainFunction(CppGenerator *this,bool parallelize)

{
  size_type sVar1;
  element_type *peVar2;
  size_t sVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  long in_RDI;
  size_t relID_1;
  size_t viewID;
  string *relName;
  size_t relID;
  size_t group;
  ofstream ofs;
  undefined1 in_stack_000009c7;
  CppGenerator *in_stack_000009c8;
  size_t in_stack_fffffffffffff7e8;
  TreeDecomposition *in_stack_fffffffffffff7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7f8;
  char *in_stack_fffffffffffff810;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff818;
  size_t in_stack_fffffffffffff820;
  CppGenerator *in_stack_fffffffffffff828;
  string local_788 [32];
  string local_768 [32];
  string local_748 [32];
  string local_728 [32];
  string local_708 [32];
  string local_6e8 [32];
  string local_6c8 [32];
  string local_6a8 [32];
  string local_688 [32];
  string local_668 [32];
  string local_648 [32];
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  ulong local_4e8;
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  ulong local_400;
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  TDNode *local_338;
  ulong local_330;
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  ulong local_2c8;
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [48];
  string local_230 [32];
  ostream local_210 [40];
  CppGenerator *in_stack_fffffffffffffe18;
  CppGenerator *in_stack_ffffffffffffff08;
  size_t *in_stack_ffffffffffffff20;
  CppGenerator *in_stack_ffffffffffffff28;
  CppGenerator *in_stack_ffffffffffffff58;
  
  std::operator+(in_stack_fffffffffffff818,in_stack_fffffffffffff810);
  std::ofstream::ofstream(local_210,local_230,_S_out);
  std::__cxx11::string::~string(local_230);
  offset_abi_cxx11_(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
  std::operator+((char *)in_stack_fffffffffffff7f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff7f0);
  std::operator+(in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0);
  std::operator+(in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0);
  std::operator<<(local_210,local_260);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string(local_2a0);
  std::__cxx11::string::~string(local_2c0);
  std::operator<<(local_210,"#include \"DataHandler.h\"\n");
  local_2c8 = 0;
  while( true ) {
    uVar5 = local_2c8;
    sVar1 = std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)(in_RDI + 0xf0));
    if (sVar1 <= uVar5) break;
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff828);
    std::operator+((char *)in_stack_fffffffffffff7f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff7f0);
    std::operator+(in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0);
    std::operator<<(local_210,local_2e8);
    std::__cxx11::string::~string(local_2e8);
    std::__cxx11::string::~string(local_308);
    std::__cxx11::string::~string(local_328);
    local_2c8 = local_2c8 + 1;
  }
  if ((*(byte *)(in_RDI + 0x2e8) & 1) != 0) {
    std::operator<<(local_210,"#include \"ApplicationHandler.h\"\n");
  }
  std::operator<<(local_210,"\nnamespace lmfao\n{\n");
  local_330 = 0;
  while( true ) {
    uVar5 = local_330;
    peVar2 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x285e69);
    sVar3 = TreeDecomposition::numberOfRelations(peVar2);
    if (sVar3 <= uVar5) break;
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x285e9c);
    local_338 = TreeDecomposition::getRelation(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
    offset_abi_cxx11_(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
    std::operator+(in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0);
    std::operator+(in_stack_fffffffffffff7f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff7f0);
    std::operator+(in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0);
    std::operator+(in_stack_fffffffffffff7f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff7f0);
    std::operator+(in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0);
    poVar4 = std::operator<<(local_210,local_358);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_358);
    std::__cxx11::string::~string(local_378);
    std::__cxx11::string::~string(local_398);
    std::__cxx11::string::~string(local_3b8);
    std::__cxx11::string::~string(local_3d8);
    std::__cxx11::string::~string(local_3f8);
    local_330 = local_330 + 1;
  }
  local_400 = 0;
  while( true ) {
    uVar5 = local_400;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x28610f);
    sVar3 = QueryCompiler::numberOfViews((QueryCompiler *)0x286117);
    if (sVar3 <= uVar5) break;
    offset_abi_cxx11_(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
    std::operator+(in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0);
    std::operator+(in_stack_fffffffffffff7f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff7f0);
    std::operator+(in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0);
    std::operator+(in_stack_fffffffffffff7f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff7f0);
    std::operator+(in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0);
    in_stack_fffffffffffff828 = (CppGenerator *)std::operator<<(local_210,local_420);
    std::ostream::operator<<
              ((ostream *)in_stack_fffffffffffff828,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_420);
    std::__cxx11::string::~string(local_440);
    std::__cxx11::string::~string(local_460);
    std::__cxx11::string::~string(local_480);
    std::__cxx11::string::~string(local_4a0);
    std::__cxx11::string::~string(local_4c0);
    local_400 = local_400 + 1;
  }
  genLoadRelationFunction_abi_cxx11_(in_stack_ffffffffffffff08);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::operator<<(local_210,local_4e0);
  std::ostream::operator<<((ostream *)__rhs,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_4e0);
  local_4e8 = 0;
  while( true ) {
    uVar5 = local_4e8;
    peVar2 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2863ff);
    sVar3 = TreeDecomposition::numberOfRelations(peVar2);
    if (sVar3 <= uVar5) break;
    genSortFunction_abi_cxx11_(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    poVar4 = std::operator<<(local_210,local_508);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_508);
    local_4e8 = local_4e8 + 1;
  }
  genRunFunction_abi_cxx11_(in_stack_000009c8,(bool)in_stack_000009c7);
  poVar4 = std::operator<<(local_210,local_528);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_528);
  genTestFunction_abi_cxx11_(in_stack_fffffffffffffe18);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::operator<<(local_210,local_548);
  genDumpFunction_abi_cxx11_(in_stack_ffffffffffffff58);
  __rhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<((ostream *)__lhs,local_568);
  std::operator<<((ostream *)__rhs_00,"}\n\n");
  std::__cxx11::string::~string(local_568);
  std::__cxx11::string::~string(local_548);
  offset_abi_cxx11_(in_stack_fffffffffffff828,(size_t)__rhs);
  std::operator+((char *)__lhs,__rhs_00);
  std::operator+(__lhs,(char *)__rhs_00);
  offset_abi_cxx11_(in_stack_fffffffffffff828,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff828,__rhs);
  std::operator+(__lhs,(char *)__rhs_00);
  std::operator+(__lhs,(char *)__rhs_00);
  offset_abi_cxx11_(in_stack_fffffffffffff828,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff828,__rhs);
  std::operator+(__lhs,(char *)__rhs_00);
  std::operator+(__lhs,(char *)__rhs_00);
  offset_abi_cxx11_(in_stack_fffffffffffff828,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff828,__rhs);
  std::operator+(__lhs,(char *)__rhs_00);
  offset_abi_cxx11_(in_stack_fffffffffffff828,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff828,__rhs);
  std::operator+(__lhs,(char *)__rhs_00);
  std::operator<<(local_210,local_588);
  std::__cxx11::string::~string(local_588);
  std::__cxx11::string::~string(local_5a8);
  std::__cxx11::string::~string(local_788);
  std::__cxx11::string::~string(local_5c8);
  std::__cxx11::string::~string(local_5e8);
  std::__cxx11::string::~string(local_768);
  std::__cxx11::string::~string(local_608);
  std::__cxx11::string::~string(local_628);
  std::__cxx11::string::~string(local_648);
  std::__cxx11::string::~string(local_748);
  std::__cxx11::string::~string(local_668);
  std::__cxx11::string::~string(local_688);
  std::__cxx11::string::~string(local_6a8);
  std::__cxx11::string::~string(local_728);
  std::__cxx11::string::~string(local_6c8);
  std::__cxx11::string::~string(local_6e8);
  std::__cxx11::string::~string(local_708);
  std::ofstream::close();
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void CppGenerator::genMainFunction(bool parallelize)
{
    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"main.cpp",std::ofstream::out);

    ofs << "#ifdef TESTING \n"+offset(1)+"#include <iomanip>\n"+"#endif\n";
    
    ofs << "#include \"DataHandler.h\"\n";
    for (size_t group = 0; group < viewGroups.size(); ++group)
        ofs << "#include \"ComputeGroup"+std::to_string(group)+".h\"\n";

    if (_hasApplicationHandler)
        ofs << "#include \"ApplicationHandler.h\"\n";
    
    ofs << "\nnamespace lmfao\n{\n";    
    // offset(1)+"//const std::std::ring PATH_TO_DATA = \"/Users/Maximilian/Documents/"+
    // "Oxford/LMFAO/"+_pathToData+"\";\n"+
    // offset(1)+"const std::string PATH_TO_DATA = \"../../"+_pathToData+"\";\n\n";

    for (size_t relID = 0; relID < _td->numberOfRelations(); ++relID)
    {
        const std::string& relName = _td->getRelation(relID)->_name;
        ofs << offset(1)+"std::vector<"+relName+"_tuple> "+relName+";" << std::endl;
    }
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        ofs << offset(1)+"std::vector<"+viewName[viewID]+"_tuple> "+
            viewName[viewID]+";" << std::endl;
    }
    
    ofs << genLoadRelationFunction() << std::endl;

    for (size_t relID = 0; relID < _td->numberOfRelations(); ++relID)
        ofs << genSortFunction(relID) << std::endl;
    
    ofs << genRunFunction(parallelize) << std::endl;
    ofs << genTestFunction() << genDumpFunction() << "}\n\n";
 
    ofs << "int main(int argc, char *argv[])\n{\n"+
        offset(1)+"std::cout << \"run lmfao\" << std::endl;\n"+
        offset(1)+"lmfao::run();\n"+
        "#ifdef TESTING\n"+offset(1)+"lmfao::ouputViewsForTesting();\n#endif\n"+
        "#ifdef DUMP_OUTPUT\n"+offset(1)+"lmfao::dumpOutputViews();\n#endif\n"+
        offset(1)+"return 0;\n};\n";
    ofs.close();
}